

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGLSLMaterialRenderer::createProgram(COpenGLSLMaterialRenderer *this)

{
  GLuint GVar1;
  GLhandleARB GVar2;
  long in_RDI;
  COpenGLExtensionHandler *in_stack_ffffffffffffffe8;
  
  if (*(ushort *)(*(long *)(in_RDI + 0x10) + 0x4d0) < 200) {
    GVar2 = COpenGLExtensionHandler::extGlCreateProgramObject(in_stack_ffffffffffffffe8);
    *(GLhandleARB *)(in_RDI + 0x24) = GVar2;
  }
  else {
    GVar1 = COpenGLExtensionHandler::extGlCreateProgram(in_stack_ffffffffffffffe8);
    *(GLuint *)(in_RDI + 0x28) = GVar1;
  }
  return true;
}

Assistant:

bool COpenGLSLMaterialRenderer::createProgram()
{
	if (Driver->Version >= 200)
		Program2 = Driver->extGlCreateProgram();
	else
		Program = Driver->extGlCreateProgramObject();
	return true;
}